

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

void __thiscall rtc::Buffer::Buffer(Buffer *this,Buffer *buf)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  FatalMessage FStack_188;
  
  sVar2 = size(buf);
  this->size_ = sVar2;
  sVar2 = capacity(buf);
  this->capacity_ = sVar2;
  (this->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (buf->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
       ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (buf->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
  .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  bVar1 = IsConsistent(this);
  if (bVar1) {
    buf->size_ = 1;
    buf->capacity_ = 0;
    return;
  }
  FatalMessage::FatalMessage
            (&FStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.cc"
             ,0x1a);
  poVar3 = std::operator<<((ostream *)&FStack_188,"Check failed: IsConsistent()");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<(poVar3,"# ");
  FatalMessage::~FatalMessage(&FStack_188);
}

Assistant:

Buffer::Buffer(Buffer&& buf)
    : size_(buf.size()),
      capacity_(buf.capacity()),
      data_(std::move(buf.data_)) {
  RTC_DCHECK(IsConsistent());
  buf.OnMovedFrom();
}